

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_unsigned_int> * __thiscall
kj::heapArray<unsigned_int_const,unsigned_int_const*>
          (Array<const_unsigned_int> *__return_storage_ptr__,kj *this,uint *begin,uint *end)

{
  undefined1 local_40 [8];
  ArrayBuilder<const_unsigned_int> builder;
  uint *end_local;
  uint *begin_local;
  
  builder.disposer = (ArrayDisposer *)begin;
  heapArrayBuilder<unsigned_int_const>
            ((ArrayBuilder<const_unsigned_int> *)local_40,(kj *)((long)begin - (long)this >> 2),
             (size_t)begin);
  ArrayBuilder<unsigned_int_const>::addAll<unsigned_int_const*,false>
            ((ArrayBuilder<unsigned_int_const> *)local_40,(uint *)this,(uint *)builder.disposer);
  ArrayBuilder<const_unsigned_int>::finish
            (__return_storage_ptr__,(ArrayBuilder<const_unsigned_int> *)local_40);
  ArrayBuilder<const_unsigned_int>::~ArrayBuilder((ArrayBuilder<const_unsigned_int> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}